

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp64.hh
# Opt level: O0

void __thiscall
helix::nasdaq::moldudp64_session<helix::parity::pmd_handler>::retransmit_request
          (moldudp64_session<helix::parity::pmd_handler> *this,uint64_t seq_no,
          uint64_t expected_seq_no)

{
  bool bVar1;
  runtime_error *this_00;
  __uint64_t in_RDX;
  function<void_(char_*,_unsigned_long)> *in_RDI;
  size_t len;
  char *base;
  moldudp64_request_packet request_packet;
  uint64_t message_count;
  unsigned_long in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  allocator *__lhs;
  undefined6 in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef6;
  undefined6 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefe;
  allocator local_99;
  string local_98 [96];
  string local_38 [32];
  __uint64_t local_18;
  
  local_18 = in_RDX;
  bVar1 = std::function::operator_cast_to_bool((function<void_(char_*,_unsigned_long)> *)0x14dbe8);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __lhs = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"invalid sequence number: ",__lhs);
    std::__cxx11::to_string(CONCAT26(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)this_00);
    std::__cxx11::to_string(CONCAT26(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0));
    std::runtime_error::runtime_error(this_00,local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __bswap_64(local_18);
  __bswap_16(0xfffe);
  std::function<void_(char_*,_unsigned_long)>::operator()
            (in_RDI,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  return;
}

Assistant:

void moldudp64_session<Handler>::retransmit_request(uint64_t seq_no, uint64_t expected_seq_no)
{
    if (!bool(_send_cb)) {
         throw std::runtime_error(std::string("invalid sequence number: ") + std::to_string(seq_no) + ", expected: " + std::to_string(expected_seq_no));
    }
    uint64_t message_count = 0xfffe;

    moldudp64_request_packet request_packet;
    request_packet.SequenceNumber = htobe64(expected_seq_no);
    request_packet.MessageCount = htobe16(message_count);

    char *base = reinterpret_cast<char*>(&request_packet);
    size_t len = sizeof(request_packet);

    _send_cb(base, len);
}